

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O3

int sha3_shake_memory(int num,uchar *in,unsigned_long inlen,uchar *out,unsigned_long *outlen)

{
  int iVar1;
  hash_state md;
  hash_state local_1d8;
  
  if (in == (uchar *)0x0) {
    sha3_shake_memory_cold_1();
  }
  if (out == (uchar *)0x0) {
    sha3_shake_memory_cold_2();
  }
  if (outlen == (unsigned_long *)0x0) {
    sha3_shake_memory_cold_3();
  }
  if ((num == 0x100) || (iVar1 = 0x10, num == 0x80)) {
    local_1d8._384_8_ = 0;
    local_1d8._392_8_ = 0;
    local_1d8._400_8_ = 0;
    local_1d8._320_8_ = 0;
    local_1d8._328_8_ = 0;
    local_1d8._336_8_ = 0;
    local_1d8._344_8_ = 0;
    local_1d8._352_8_ = 0;
    local_1d8._360_8_ = 0;
    local_1d8._368_8_ = 0;
    local_1d8._376_8_ = 0;
    local_1d8._256_8_ = 0;
    local_1d8._264_8_ = 0;
    local_1d8._272_8_ = 0;
    local_1d8._280_8_ = 0;
    local_1d8._288_8_ = 0;
    local_1d8._296_8_ = 0;
    local_1d8._304_8_ = 0;
    local_1d8._312_8_ = 0;
    local_1d8.sha3.s[0x17] = 0;
    local_1d8.sha3.s[0x18] = 0;
    local_1d8._208_8_ = 0;
    local_1d8._216_8_ = 0;
    local_1d8.blake2b.curlen = 0;
    local_1d8.blake2b.outlen = 0;
    local_1d8._240_8_ = 0;
    local_1d8._248_8_ = 0;
    local_1d8.sha3.s[0xf] = 0;
    local_1d8.sha3.s[0x10] = 0;
    local_1d8.sha3.s[0x11] = 0;
    local_1d8.sha3.s[0x12] = 0;
    local_1d8.sha3.s[0x13] = 0;
    local_1d8.sha3.s[0x14] = 0;
    local_1d8.sha3.s[0x15] = 0;
    local_1d8.sha3.s[0x16] = 0;
    local_1d8.whirlpool.state[7] = 0;
    local_1d8.sha3.s[8] = 0;
    local_1d8.sha3.s[9] = 0;
    local_1d8.sha3.s[10] = 0;
    local_1d8.sha3.s[0xb] = 0;
    local_1d8.sha3.s[0xc] = 0;
    local_1d8.sha3.s[0xd] = 0;
    local_1d8.sha3.s[0xe] = 0;
    local_1d8.chc.length = 0;
    local_1d8.whirlpool.state[0] = 0;
    local_1d8.whirlpool.state[1] = 0;
    local_1d8.whirlpool.state[2] = 0;
    local_1d8.whirlpool.state[3] = 0;
    local_1d8.whirlpool.state[4] = 0;
    local_1d8.whirlpool.state[5] = 0;
    local_1d8.whirlpool.state[6] = 0;
    local_1d8._408_8_ = (ulong)(ushort)((uint)num >> 5) << 0x20;
    sha3_process(&local_1d8,in,inlen);
    sha3_shake_done(&local_1d8,out,*outlen);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int sha3_shake_memory(int num, const unsigned char *in, unsigned long inlen, unsigned char *out, unsigned long *outlen)
{
   hash_state md;
   int err;
   LTC_ARGCHK(in  != NULL);
   LTC_ARGCHK(out != NULL);
   LTC_ARGCHK(outlen != NULL);
   if ((err = sha3_shake_init(&md, num))          != CRYPT_OK) return err;
   if ((err = sha3_shake_process(&md, in, inlen)) != CRYPT_OK) return err;
   if ((err = sha3_shake_done(&md, out, *outlen)) != CRYPT_OK) return err;
   return CRYPT_OK;
}